

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmAddiEa<(moira::Instr)6,(moira::Mode)7,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  i32 v;
  StrWriter *pSVar2;
  StrWriter *in_RSI;
  u32 *in_RDI;
  Ea<(moira::Mode)7,_(moira::Size)2> dst;
  Ims src;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined6 in_stack_ffffffffffffffc8;
  u16 in_stack_ffffffffffffffce;
  undefined4 in_stack_ffffffffffffffd0;
  Ims in_stack_ffffffffffffffd4;
  Ims local_20 [4];
  StrWriter *local_10;
  
  local_10 = in_RSI;
  uVar1 = dasmRead<(moira::Size)2>
                    ((Moira *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI);
  v = SEXT<(moira::Size)2>((ulong)uVar1);
  Ims::Ims(local_20,v);
  Op<(moira::Mode)7,(moira::Size)2>
            ((Moira *)CONCAT44(in_stack_ffffffffffffffd4.raw,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffce,
             (u32 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  pSVar2 = StrWriter::operator<<(local_10);
  pSVar2 = StrWriter::operator<<(pSVar2);
  StrWriter::operator<<(pSVar2,(Align)in_RDI[5]);
  pSVar2 = StrWriter::operator<<
                     ((StrWriter *)CONCAT26(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8),
                      in_stack_ffffffffffffffd4);
  StrWriter::operator<<(pSVar2,", ");
  StrWriter::operator<<
            ((StrWriter *)CONCAT44(in_stack_ffffffffffffffd4.raw,in_stack_ffffffffffffffd0),
             (Ea<(moira::Mode)7,_(moira::Size)2> *)
             CONCAT26(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8));
  return;
}

Assistant:

void
Moira::dasmAddiEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Ims      ( SEXT<S>(dasmRead<S>(addr)) );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}